

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O0

void __thiscall
ON_3dmRenderSettingsPrivate::SpecializeLinearWorkflow
          (ON_3dmRenderSettingsPrivate *this,ON_LinearWorkflow *lw)

{
  ON_LinearWorkflow *lw_local;
  ON_3dmRenderSettingsPrivate *this_local;
  
  ON_REMOVE_ASAP_AssertEx
            ((uint)((this->_lw_specialized ^ 0xffU) & 1),
             "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_3dm_settings.cpp"
             ,0x4a0,"","!_lw_specialized is false");
  ON_LinearWorkflow::SetXMLNode(lw,&(this->_rdk_document_data).super_ON_XMLNode);
  if (this->_linear_workflow != (ON_LinearWorkflow *)0x0) {
    (*this->_linear_workflow->_vptr_ON_LinearWorkflow[1])();
  }
  this->_linear_workflow = lw;
  this->_lw_specialized = true;
  return;
}

Assistant:

void ON_3dmRenderSettingsPrivate::SpecializeLinearWorkflow(ON_LinearWorkflow& lw)
{
  // This is called from ON_SpecializeDocumentObjects() and is only called once during the lifetime of this.
  ON_ASSERT(!_lw_specialized);

  // Make the incoming object use the document data of this.
  lw.SetXMLNode(_rdk_document_data);

  // Replace the vanilla linear workflow with the incoming object. This takes ownership of it.
  delete _linear_workflow;
  _linear_workflow = &lw;

  _lw_specialized = true;
}